

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>::
emplaceRealloc<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>
          (SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>
           *this,pointer pos,
          variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *args)

{
  ulong uVar1;
  undefined8 uVar2;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *__cur_1;
  undefined8 *puVar3;
  pointer pvVar4;
  undefined8 *puVar5;
  pointer pvVar6;
  EVP_PKEY_CTX *pEVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar7 = (EVP_PKEY_CTX *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar7 < ctx) {
    pEVar7 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar7 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar8 = (long)pos - *(long *)this;
  puVar3 = (undefined8 *)operator_new((long)pEVar7 << 4);
  uVar2 = *(undefined8 *)
           &(args->
            super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
            super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
            super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
            super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
            super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
            super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
            ._M_index;
  *(undefined8 *)((long)puVar3 + lVar8) =
       (args->super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
       super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       _M_u;
  ((undefined8 *)((long)puVar3 + lVar8))[1] = uVar2;
  pvVar6 = *(pointer *)this;
  pvVar4 = pvVar6 + *(long *)(this + 8);
  puVar5 = puVar3;
  if (pvVar4 == pos) {
    for (; pvVar6 != pos; pvVar6 = pvVar6 + 1) {
      uVar2 = *(undefined8 *)
               &(pvVar6->
                super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
                super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                ._M_index;
      *puVar5 = (pvVar6->
                super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
                super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                ._M_u;
      puVar5[1] = uVar2;
      puVar5 = puVar5 + 2;
    }
  }
  else {
    for (; pvVar6 != pos; pvVar6 = pvVar6 + 1) {
      uVar2 = *(undefined8 *)
               &(pvVar6->
                super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
                super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                ._M_index;
      *puVar5 = (pvVar6->
                super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
                super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                ._M_u;
      puVar5[1] = uVar2;
      puVar5 = puVar5 + 2;
    }
    puVar5 = (undefined8 *)(lVar8 + (long)puVar3);
    for (; pos != pvVar4; pos = pos + 1) {
      uVar2 = *(undefined8 *)
               &(pos->
                super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
                super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                ._M_index;
      puVar5[2] = (pos->
                  super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                  ).
                  super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                  .
                  super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                  .
                  super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                  .
                  super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                  .
                  super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                  ._M_u;
      puVar5[3] = uVar2;
      puVar5 = puVar5 + 2;
    }
  }
  SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>::
  cleanup((SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
           *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(EVP_PKEY_CTX **)(this + 0x10) = pEVar7;
  *(undefined8 **)this = puVar3;
  return (pointer)((long)puVar3 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}